

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O1

void __thiscall
Catch::Generators::Generators<double>::
Generators<Catch::Generators::GeneratorWrapper<double>,double>
          (Generators<double> *this,GeneratorWrapper<double> *moreGenerators,
          double *moreGenerators_1)

{
  (this->super_IGenerator<double>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus._M_p =
       (pointer)&(this->super_IGenerator<double>).super_GeneratorUntypedBase.m_stringReprCache.
                 field_2;
  (this->super_IGenerator<double>).super_GeneratorUntypedBase.m_stringReprCache._M_string_length = 0
  ;
  (this->super_IGenerator<double>).super_GeneratorUntypedBase.m_stringReprCache.field_2._M_local_buf
  [0] = '\0';
  (this->super_IGenerator<double>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<double>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_004f4098;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<double>,_std::allocator<Catch::Generators::GeneratorWrapper<double>_>_>
  ::reserve(&this->m_generators,2);
  std::
  vector<Catch::Generators::GeneratorWrapper<double>,std::allocator<Catch::Generators::GeneratorWrapper<double>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<double>>
            ((vector<Catch::Generators::GeneratorWrapper<double>,std::allocator<Catch::Generators::GeneratorWrapper<double>>>
              *)&this->m_generators,moreGenerators);
  add_generator(this,moreGenerators_1);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }